

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void Clasp::destroyDB(ConstraintDB *db,Solver *s,bool detach)

{
  Constraint *pCVar1;
  size_type sVar2;
  
  if (s != (Solver *)0x0 && detach) {
    Solver::destroyDB(s,db);
    return;
  }
  sVar2 = (db->ebo_).size;
  if (sVar2 != 0) {
    do {
      pCVar1 = (db->ebo_).buf[sVar2 - 1];
      (*pCVar1->_vptr_Constraint[5])(pCVar1,s,(ulong)detach);
      sVar2 = (db->ebo_).size - 1;
      (db->ebo_).size = sVar2;
    } while (sVar2 != 0);
  }
  return;
}

Assistant:

void destroyDB(Solver::ConstraintDB& db, Solver* s, bool detach) {
	if (s && detach) {
		s->destroyDB(db);
		return;
	}
	while (!db.empty()) {
		db.back()->destroy(s, detach);
		db.pop_back();
	}
}